

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O2

OPJ_BOOL opj_j2k_update_rates
                   (opj_j2k_t *p_j2k,opj_stream_private_t *p_stream,opj_event_mgr_t *p_manager)

{
  OPJ_UINT32 OVar1;
  OPJ_UINT32 OVar2;
  opj_image_t *poVar3;
  OPJ_UINT32 OVar4;
  int iVar5;
  OPJ_UINT32 OVar6;
  OPJ_OFF_T OVar7;
  opj_tcp_t *poVar8;
  OPJ_BYTE *pOVar9;
  OPJ_UINT32 OVar10;
  long lVar11;
  OPJ_UINT32 *pOVar12;
  OPJ_UINT32 OVar13;
  uint uVar14;
  OPJ_BOOL OVar15;
  uint uVar16;
  OPJ_UINT32 OVar17;
  OPJ_UINT32 OVar18;
  int iVar19;
  code *pcVar20;
  uint uVar21;
  opj_image_comp_t *poVar22;
  uint uVar23;
  bool bVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  
  if (p_j2k == (opj_j2k_t *)0x0) {
    __assert_fail("p_j2k != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                  ,0x13be,
                  "OPJ_BOOL opj_j2k_update_rates(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  if (p_manager != (opj_event_mgr_t *)0x0) {
    if (p_stream == (opj_stream_private_t *)0x0) {
      __assert_fail("p_stream != 00",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                    ,0x13c0,
                    "OPJ_BOOL opj_j2k_update_rates(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                   );
    }
    poVar3 = p_j2k->m_private_image;
    poVar8 = (p_j2k->m_cp).tcps;
    poVar22 = poVar3->comps;
    OVar4 = poVar22->dx;
    OVar10 = poVar22->dy;
    OVar6 = poVar22->prec;
    OVar1 = poVar3->numcomps;
    OVar7 = opj_stream_tell(p_stream);
    uVar14 = (p_j2k->m_cp).tw;
    uVar21 = (p_j2k->m_cp).th;
    uVar16 = uVar14 * uVar21;
    pcVar20 = opj_j2k_get_tp_stride;
    if ((*(byte *)((long)&(p_j2k->m_cp).m_specific_param + 0x11) & 8) == 0) {
      pcVar20 = opj_j2k_get_default_stride;
    }
    fVar27 = (float)(OVar4 * OVar10 * 8);
    uVar23 = 0;
    while (uVar23 < uVar21) {
      uVar21 = 0;
      while (uVar21 < uVar14) {
        fVar25 = (float)(*pcVar20)(poVar8);
        uVar14 = poVar8->numlayers;
        OVar4 = (p_j2k->m_cp).tdx;
        OVar10 = (p_j2k->m_cp).tx0;
        OVar17 = (p_j2k->m_cp).ty0;
        OVar13 = OVar4 * uVar21 + OVar10;
        if ((int)OVar13 <= (int)poVar3->x0) {
          OVar13 = poVar3->x0;
        }
        OVar2 = (p_j2k->m_cp).tdy;
        OVar18 = OVar2 * uVar23 + OVar17;
        if ((int)OVar18 <= (int)poVar3->y0) {
          OVar18 = poVar3->y0;
        }
        uVar21 = uVar21 + 1;
        OVar10 = OVar4 * uVar21 + OVar10;
        if ((int)poVar3->x1 <= (int)OVar10) {
          OVar10 = poVar3->x1;
        }
        OVar17 = OVar2 * (uVar23 + 1) + OVar17;
        if ((int)poVar3->y1 <= (int)OVar17) {
          OVar17 = poVar3->y1;
        }
        fVar25 = fVar25 / (float)uVar14;
        fVar26 = (float)((OVar17 - OVar18) * (OVar10 - OVar13) * OVar6 * OVar1);
        if (0.0 < (float)poVar8->rates[0]) {
          poVar8->rates[0] = (OPJ_FLOAT32)(fVar26 / ((float)poVar8->rates[0] * fVar27) - fVar25);
        }
        for (lVar11 = 6; (int)lVar11 - 5U < uVar14; lVar11 = lVar11 + 1) {
          if (0.0 < (float)poVar8->rates[lVar11 + -5]) {
            poVar8->rates[lVar11 + -5] =
                 (OPJ_FLOAT32)(fVar26 / ((float)poVar8->rates[lVar11 + -5] * fVar27) - fVar25);
          }
        }
        poVar8 = poVar8 + 1;
        uVar14 = (p_j2k->m_cp).tw;
      }
      uVar23 = uVar23 + 1;
      uVar21 = (p_j2k->m_cp).th;
    }
    fVar27 = (float)OVar7 / (float)uVar16;
    poVar8 = (p_j2k->m_cp).tcps;
    for (uVar14 = 0; uVar14 != uVar21; uVar14 = uVar14 + 1) {
      OVar4 = (p_j2k->m_cp).tw;
      for (OVar10 = 0; OVar10 != OVar4; OVar10 = OVar10 + 1) {
        if ((0.0 < (float)poVar8->rates[0]) &&
           (fVar25 = (float)poVar8->rates[0] - fVar27, poVar8->rates[0] = (OPJ_FLOAT32)fVar25,
           fVar25 < 30.0)) {
          poVar8->rates[0] = 30.0;
        }
        OVar6 = poVar8->numlayers;
        for (lVar11 = 6; fVar25 = (float)poVar8->rates[lVar11 + -5], (int)lVar11 - 5U < OVar6 - 1;
            lVar11 = lVar11 + 1) {
          if (0.0 < fVar25) {
            poVar8->rates[lVar11 + -5] = (OPJ_FLOAT32)(fVar25 - fVar27);
            if (fVar25 - fVar27 < (float)poVar8->rates[lVar11 + -6] + 10.0) {
              poVar8->rates[lVar11 + -5] = (OPJ_FLOAT32)((float)poVar8->rates[lVar11 + -6] + 20.0);
            }
          }
        }
        if (0.0 < fVar25) {
          fVar25 = fVar25 - (fVar27 + 2.0);
          poVar8->rates[lVar11 + -5] = (OPJ_FLOAT32)fVar25;
          if (fVar25 < (float)poVar8->rates[lVar11 + -6] + 10.0) {
            poVar8->rates[lVar11 + -5] = (OPJ_FLOAT32)((float)poVar8->rates[lVar11 + -6] + 20.0);
          }
        }
        poVar8 = poVar8 + 1;
      }
    }
    poVar22 = poVar3->comps;
    uVar14 = 0;
    for (uVar21 = 0; uVar21 < poVar3->numcomps; uVar21 = uVar21 + 1) {
      OVar4 = opj_uint_ceildiv((p_j2k->m_cp).tdx,poVar22->dx);
      OVar10 = opj_uint_ceildiv((p_j2k->m_cp).tdy,poVar22->dy);
      uVar14 = uVar14 + OVar10 * OVar4 * poVar22->prec;
      poVar22 = poVar22 + 1;
    }
    OVar4 = p_j2k->m_private_image->numcomps;
    iVar5 = (p_j2k->m_cp).th * (p_j2k->m_cp).tw;
    poVar8 = (p_j2k->m_cp).tcps;
    pOVar12 = &poVar8->m_nb_tile_parts;
    uVar21 = 0;
    iVar19 = iVar5;
    while (bVar24 = iVar19 != 0, iVar19 = iVar19 + -1, bVar24) {
      if (uVar21 <= *pOVar12) {
        uVar21 = *pOVar12;
      }
      pOVar12 = pOVar12 + 0x590;
    }
    iVar19 = uVar21 * 0xc;
    if (3 < (ushort)((short)*(undefined4 *)&p_j2k->m_cp - 3U)) {
      OVar10 = opj_j2k_get_max_coc_size(p_j2k);
      OVar6 = opj_j2k_get_max_coc_size(p_j2k);
      iVar19 = iVar19 + (OVar6 + OVar10) * (OVar4 - 1);
      poVar8 = (p_j2k->m_cp).tcps;
      iVar5 = (p_j2k->m_cp).tw * (p_j2k->m_cp).th;
    }
    pOVar12 = &poVar8->numpocs;
    uVar21 = 0;
    while (bVar24 = iVar5 != 0, iVar5 = iVar5 + -1, bVar24) {
      if (uVar21 <= *pOVar12) {
        uVar21 = *pOVar12;
      }
      pOVar12 = pOVar12 + 0x590;
    }
    uVar14 = (int)(long)((double)uVar14 * 1.4 * 0.125) + iVar19 + uVar21 * 9 + 0x201;
    (p_j2k->m_specific_param).m_encoder.m_encoded_tile_size = uVar14;
    pOVar9 = (OPJ_BYTE *)opj_malloc((ulong)uVar14);
    (p_j2k->m_specific_param).m_encoder.m_encoded_tile_data = pOVar9;
    OVar15 = 0;
    if (pOVar9 != (OPJ_BYTE *)0x0) {
      if ((ushort)((short)*(undefined4 *)&p_j2k->m_cp - 3U) < 4) {
        pOVar9 = (OPJ_BYTE *)
                 opj_malloc((ulong)((p_j2k->m_specific_param).m_decoder.m_start_tile_x * 5));
        (p_j2k->m_specific_param).m_decoder.m_header_data = pOVar9;
        if (pOVar9 == (OPJ_BYTE *)0x0) {
          return 0;
        }
        (p_j2k->m_specific_param).m_encoder.m_tlm_sot_offsets_current = pOVar9;
      }
      OVar15 = 1;
    }
    return OVar15;
  }
  __assert_fail("p_manager != 00",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                ,0x13bf,
                "OPJ_BOOL opj_j2k_update_rates(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)"
               );
}

Assistant:

static OPJ_BOOL opj_j2k_update_rates(opj_j2k_t *p_j2k,
                                     opj_stream_private_t *p_stream,
                                     opj_event_mgr_t * p_manager)
{
    opj_cp_t * l_cp = 00;
    opj_image_t * l_image = 00;
    opj_tcp_t * l_tcp = 00;
    opj_image_comp_t * l_img_comp = 00;

    OPJ_UINT32 i, j, k;
    OPJ_INT32 l_x0, l_y0, l_x1, l_y1;
    OPJ_FLOAT32 * l_rates = 0;
    OPJ_FLOAT32 l_sot_remove;
    OPJ_UINT32 l_bits_empty, l_size_pixel;
    OPJ_UINT32 l_tile_size = 0;
    OPJ_UINT32 l_last_res;
    OPJ_FLOAT32(* l_tp_stride_func)(opj_tcp_t *) = 00;

    /* preconditions */
    assert(p_j2k != 00);
    assert(p_manager != 00);
    assert(p_stream != 00);

    OPJ_UNUSED(p_manager);

    l_cp = &(p_j2k->m_cp);
    l_image = p_j2k->m_private_image;
    l_tcp = l_cp->tcps;

    l_bits_empty = 8 * l_image->comps->dx * l_image->comps->dy;
    l_size_pixel = l_image->numcomps * l_image->comps->prec;
    l_sot_remove = (OPJ_FLOAT32) opj_stream_tell(p_stream) / (OPJ_FLOAT32)(
                       l_cp->th * l_cp->tw);

    if (l_cp->m_specific_param.m_enc.m_tp_on) {
        l_tp_stride_func = opj_j2k_get_tp_stride;
    } else {
        l_tp_stride_func = opj_j2k_get_default_stride;
    }

    for (i = 0; i < l_cp->th; ++i) {
        for (j = 0; j < l_cp->tw; ++j) {
            OPJ_FLOAT32 l_offset = (OPJ_FLOAT32)(*l_tp_stride_func)(l_tcp) /
                                   (OPJ_FLOAT32)l_tcp->numlayers;

            /* 4 borders of the tile rescale on the image if necessary */
            l_x0 = opj_int_max((OPJ_INT32)(l_cp->tx0 + j * l_cp->tdx),
                               (OPJ_INT32)l_image->x0);
            l_y0 = opj_int_max((OPJ_INT32)(l_cp->ty0 + i * l_cp->tdy),
                               (OPJ_INT32)l_image->y0);
            l_x1 = opj_int_min((OPJ_INT32)(l_cp->tx0 + (j + 1) * l_cp->tdx),
                               (OPJ_INT32)l_image->x1);
            l_y1 = opj_int_min((OPJ_INT32)(l_cp->ty0 + (i + 1) * l_cp->tdy),
                               (OPJ_INT32)l_image->y1);

            l_rates = l_tcp->rates;

            /* Modification of the RATE >> */
            if (*l_rates > 0.0f) {
                *l_rates = (((OPJ_FLOAT32)(l_size_pixel * (OPJ_UINT32)(l_x1 - l_x0) *
                                           (OPJ_UINT32)(l_y1 - l_y0)))
                            /
                            ((*l_rates) * (OPJ_FLOAT32)l_bits_empty)
                           )
                           -
                           l_offset;
            }

            ++l_rates;

            for (k = 1; k < l_tcp->numlayers; ++k) {
                if (*l_rates > 0.0f) {
                    *l_rates = (((OPJ_FLOAT32)(l_size_pixel * (OPJ_UINT32)(l_x1 - l_x0) *
                                               (OPJ_UINT32)(l_y1 - l_y0)))
                                /
                                ((*l_rates) * (OPJ_FLOAT32)l_bits_empty)
                               )
                               -
                               l_offset;
                }

                ++l_rates;
            }

            ++l_tcp;

        }
    }

    l_tcp = l_cp->tcps;

    for (i = 0; i < l_cp->th; ++i) {
        for (j = 0; j < l_cp->tw; ++j) {
            l_rates = l_tcp->rates;

            if (*l_rates > 0.0f) {
                *l_rates -= l_sot_remove;

                if (*l_rates < 30.0f) {
                    *l_rates = 30.0f;
                }
            }

            ++l_rates;

            l_last_res = l_tcp->numlayers - 1;

            for (k = 1; k < l_last_res; ++k) {

                if (*l_rates > 0.0f) {
                    *l_rates -= l_sot_remove;

                    if (*l_rates < * (l_rates - 1) + 10.0f) {
                        *l_rates  = (*(l_rates - 1)) + 20.0f;
                    }
                }

                ++l_rates;
            }

            if (*l_rates > 0.0f) {
                *l_rates -= (l_sot_remove + 2.f);

                if (*l_rates < * (l_rates - 1) + 10.0f) {
                    *l_rates  = (*(l_rates - 1)) + 20.0f;
                }
            }

            ++l_tcp;
        }
    }

    l_img_comp = l_image->comps;
    l_tile_size = 0;

    for (i = 0; i < l_image->numcomps; ++i) {
        l_tile_size += (opj_uint_ceildiv(l_cp->tdx, l_img_comp->dx)
                        *
                        opj_uint_ceildiv(l_cp->tdy, l_img_comp->dy)
                        *
                        l_img_comp->prec
                       );

        ++l_img_comp;
    }

    /* TODO: where does this magic value come from ? */
    /* This used to be 1.3 / 8, but with random data and very small code */
    /* block sizes, this is not enough. For example with */
    /* bin/test_tile_encoder 1 256 256 32 32 8 0 reversible_with_precinct.j2k 4 4 3 0 0 1 16 16 */
    /* TODO revise this to take into account the overhead linked to the */
    /* number of packets and number of code blocks in packets */
    l_tile_size = (OPJ_UINT32)(l_tile_size * 1.4 / 8);

    /* Arbitrary amount to make the following work: */
    /* bin/test_tile_encoder 1 256 256 17 16 8 0 reversible_no_precinct.j2k 4 4 3 0 0 1 */
    l_tile_size += 500;

    l_tile_size += opj_j2k_get_specific_header_sizes(p_j2k);

    p_j2k->m_specific_param.m_encoder.m_encoded_tile_size = l_tile_size;
    p_j2k->m_specific_param.m_encoder.m_encoded_tile_data =
        (OPJ_BYTE *) opj_malloc(p_j2k->m_specific_param.m_encoder.m_encoded_tile_size);
    if (p_j2k->m_specific_param.m_encoder.m_encoded_tile_data == 00) {
        return OPJ_FALSE;
    }

    if (OPJ_IS_CINEMA(l_cp->rsiz)) {
        p_j2k->m_specific_param.m_encoder.m_tlm_sot_offsets_buffer =
            (OPJ_BYTE *) opj_malloc(5 *
                                    p_j2k->m_specific_param.m_encoder.m_total_tile_parts);
        if (! p_j2k->m_specific_param.m_encoder.m_tlm_sot_offsets_buffer) {
            return OPJ_FALSE;
        }

        p_j2k->m_specific_param.m_encoder.m_tlm_sot_offsets_current =
            p_j2k->m_specific_param.m_encoder.m_tlm_sot_offsets_buffer;
    }

    return OPJ_TRUE;
}